

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O1

void __thiscall FTextureManager::DeleteAll(FTextureManager *this)

{
  uint uVar1;
  long *plVar2;
  FAnimDef *block;
  FSwitchDef *block_00;
  void *pvVar3;
  uchar *puVar4;
  long lVar5;
  ulong uVar6;
  
  if ((this->Textures).Count != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      plVar2 = *(long **)((long)&((this->Textures).Array)->Texture + lVar5);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      uVar6 = uVar6 + 1;
      uVar1 = (this->Textures).Count;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < uVar1);
    if (uVar1 != 0) {
      (this->Textures).Count = 0;
    }
  }
  if ((this->Translation).Count != 0) {
    (this->Translation).Count = 0;
  }
  if ((this->FirstTextureForFile).Count != 0) {
    (this->FirstTextureForFile).Count = 0;
  }
  memset(this->HashFirst,0xff,0x1010);
  if ((this->mAnimations).Count != 0) {
    uVar6 = 0;
    do {
      block = (this->mAnimations).Array[uVar6];
      if (block != (FAnimDef *)0x0) {
        M_Free(block);
        (this->mAnimations).Array[uVar6] = (FAnimDef *)0x0;
      }
      uVar6 = uVar6 + 1;
      uVar1 = (this->mAnimations).Count;
    } while (uVar6 < uVar1);
    if (uVar1 != 0) {
      (this->mAnimations).Count = 0;
    }
  }
  if ((this->mSwitchDefs).Count != 0) {
    uVar6 = 0;
    do {
      block_00 = (this->mSwitchDefs).Array[uVar6];
      if (block_00 != (FSwitchDef *)0x0) {
        M_Free(block_00);
        (this->mSwitchDefs).Array[uVar6] = (FSwitchDef *)0x0;
      }
      uVar6 = uVar6 + 1;
      uVar1 = (this->mSwitchDefs).Count;
    } while (uVar6 < uVar1);
    if (uVar1 != 0) {
      (this->mSwitchDefs).Count = 0;
    }
  }
  if ((this->mAnimatedDoors).Count != 0) {
    lVar5 = 8;
    uVar6 = 0;
    do {
      pvVar3 = *(void **)((long)&(((this->mAnimatedDoors).Array)->BaseTexture).texnum + lVar5);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
        *(undefined8 *)((long)&(((this->mAnimatedDoors).Array)->BaseTexture).texnum + lVar5) = 0;
      }
      uVar6 = uVar6 + 1;
      uVar1 = (this->mAnimatedDoors).Count;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 < uVar1);
    if (uVar1 != 0) {
      (this->mAnimatedDoors).Count = 0;
    }
  }
  if ((this->BuildTileFiles).Count != 0) {
    uVar6 = 0;
    do {
      puVar4 = (this->BuildTileFiles).Array[uVar6];
      if (puVar4 != (uchar *)0x0) {
        operator_delete__(puVar4);
      }
      uVar6 = uVar6 + 1;
      uVar1 = (this->BuildTileFiles).Count;
    } while (uVar6 < uVar1);
    if (uVar1 != 0) {
      (this->BuildTileFiles).Count = 0;
    }
  }
  return;
}

Assistant:

void FTextureManager::DeleteAll()
{
	for (unsigned int i = 0; i < Textures.Size(); ++i)
	{
		delete Textures[i].Texture;
	}
	Textures.Clear();
	Translation.Clear();
	FirstTextureForFile.Clear();
	memset (HashFirst, -1, sizeof(HashFirst));
	DefaultTexture.SetInvalid();

	for (unsigned i = 0; i < mAnimations.Size(); i++)
	{
		if (mAnimations[i] != NULL)
		{
			M_Free (mAnimations[i]);
			mAnimations[i] = NULL;
		}
	}
	mAnimations.Clear();

	for (unsigned i = 0; i < mSwitchDefs.Size(); i++)
	{
		if (mSwitchDefs[i] != NULL)
		{
			M_Free (mSwitchDefs[i]);
			mSwitchDefs[i] = NULL;
		}
	}
	mSwitchDefs.Clear();

	for (unsigned i = 0; i < mAnimatedDoors.Size(); i++)
	{
		if (mAnimatedDoors[i].TextureFrames != NULL)
		{
			delete[] mAnimatedDoors[i].TextureFrames;
			mAnimatedDoors[i].TextureFrames = NULL;
		}
	}
	mAnimatedDoors.Clear();

	for (unsigned int i = 0; i < BuildTileFiles.Size(); ++i)
	{
		delete[] BuildTileFiles[i];
	}
	BuildTileFiles.Clear();
}